

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_node_scalar_bin(REF_NODE ref_node,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  uint uVar1;
  clock_t cVar2;
  size_t sVar3;
  int local_e0;
  double local_d8;
  int local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  clock_t disk_toc;
  clock_t mpi_toc;
  clock_t local_toc;
  clock_t tic;
  int local_78;
  REF_STATUS status;
  REF_INT im;
  REF_INT i;
  REF_INT n;
  REF_INT local;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_GLOB global;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_INT nchunk;
  REF_INT chunk;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_DBL *scalar_local;
  REF_NODE pRStack_18;
  REF_INT ldim_local;
  REF_NODE ref_node_local;
  
  _nchunk = ref_node->ref_mpi;
  local_toc = 0;
  mpi_toc = 0;
  disk_toc = 0;
  _ref_private_macro_code_rss = 0;
  local_c4 = (int)(ref_node->old_n_global / (long)_nchunk->n) + 1;
  if (_nchunk->reduce_byte_limit < 1) {
    local_c0 = 0x7fffffff;
  }
  else {
    local_c0 = _nchunk->reduce_byte_limit / ((ldim + 1) * 8);
  }
  if (local_c0 <= local_c4) {
    if (_nchunk->reduce_byte_limit < 1) {
      local_c8 = 0x7fffffff;
    }
    else {
      local_c8 = _nchunk->reduce_byte_limit / ((ldim + 1) * 8);
    }
    local_c4 = local_c8;
  }
  local_xyzm._4_4_ = local_c4;
  ref_mpi = (REF_MPI)file;
  file_local = (FILE *)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_18 = ref_node;
  if ((ldim + 1) * local_c4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x67d,
           "ref_gather_node_scalar_bin","malloc local_xyzm of REF_DBL negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    xyzm = (REF_DBL *)malloc((long)((ldim + 1) * local_c4) << 3);
    if (xyzm == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x67d,"ref_gather_node_scalar_bin","malloc local_xyzm of REF_DBL NULL");
      ref_node_local._4_4_ = 2;
    }
    else if ((scalar_local._4_4_ + 1) * local_xyzm._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x67e,"ref_gather_node_scalar_bin","malloc xyzm of REF_DBL negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      global = (REF_GLOB)malloc((long)((scalar_local._4_4_ + 1) * local_xyzm._4_4_) << 3);
      if ((void *)global == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x67e,"ref_gather_node_scalar_bin","malloc xyzm of REF_DBL NULL");
        ref_node_local._4_4_ = 2;
      }
      else {
        local_xyzm._0_4_ = 0;
        first = 0;
        while (first < pRStack_18->old_n_global) {
          local_xyzm._0_4_ = (uint)local_xyzm + 1;
          _n = first;
          if ((long)local_xyzm._4_4_ < pRStack_18->old_n_global - first) {
            local_d0 = local_xyzm._4_4_;
          }
          else {
            local_d0 = (int)pRStack_18->old_n_global - (int)first;
          }
          first = local_d0 + first;
          if (1 < _nchunk->timing) {
            local_toc = clock();
          }
          for (status = 0; status < (scalar_local._4_4_ + 1) * local_xyzm._4_4_; status = status + 1
              ) {
            xyzm[status] = 0.0;
          }
          for (status = 0; status < local_d0; status = status + 1) {
            nnode_written = _n + status;
            uVar1 = ::ref_node_local(pRStack_18,nnode_written,&i);
            if ((uVar1 != 0) && (uVar1 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x68f,"ref_gather_node_scalar_bin",(ulong)uVar1,"node local failed");
              return uVar1;
            }
            if ((uVar1 == 0) && (_nchunk->id == pRStack_18->part[i])) {
              for (local_78 = 0; local_78 < scalar_local._4_4_; local_78 = local_78 + 1) {
                xyzm[local_78 + (scalar_local._4_4_ + 1) * status] =
                     *(REF_DBL *)
                      (&file_local->_flags + (long)(local_78 + scalar_local._4_4_ * i) * 2);
              }
              xyzm[scalar_local._4_4_ + (scalar_local._4_4_ + 1) * status] = 1.0;
            }
            else {
              for (local_78 = 0; local_78 < scalar_local._4_4_ + 1; local_78 = local_78 + 1) {
                xyzm[local_78 + (scalar_local._4_4_ + 1) * status] = 0.0;
              }
            }
          }
          if (1 < _nchunk->timing) {
            cVar2 = clock();
            mpi_toc = (cVar2 - local_toc) + mpi_toc;
          }
          if (1 < _nchunk->timing) {
            local_toc = clock();
          }
          uVar1 = ref_mpi_sum(_nchunk,xyzm,(void *)global,(scalar_local._4_4_ + 1) * local_d0,3);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x69e,"ref_gather_node_scalar_bin",(ulong)uVar1,"sum");
            return uVar1;
          }
          if (1 < _nchunk->timing) {
            cVar2 = clock();
            disk_toc = (cVar2 - local_toc) + disk_toc;
          }
          if (1 < _nchunk->timing) {
            local_toc = clock();
          }
          if (_nchunk->id == 0) {
            for (status = 0; status < local_d0; status = status + 1) {
              if (*(double *)
                   (global + (long)(scalar_local._4_4_ + (scalar_local._4_4_ + 1) * status) * 8) -
                  1.0 <= 0.0) {
                local_d8 = -(*(double *)
                              (global + (long)(scalar_local._4_4_ +
                                              (scalar_local._4_4_ + 1) * status) * 8) - 1.0);
              }
              else {
                local_d8 = *(double *)
                            (global + (long)(scalar_local._4_4_ + (scalar_local._4_4_ + 1) * status)
                                      * 8) - 1.0;
              }
              if (0.1 < local_d8) {
                printf("error gather node %ld %f\n",
                       *(undefined8 *)
                        (global + (long)(scalar_local._4_4_ + (scalar_local._4_4_ + 1) * status) * 8
                        ),_n + status);
              }
              for (local_78 = 0; local_78 < scalar_local._4_4_; local_78 = local_78 + 1) {
                sVar3 = fwrite((void *)(global + (long)(local_78 + (scalar_local._4_4_ + 1) * status
                                                       ) * 8),8,1,(FILE *)ref_mpi);
                if (sVar3 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x6ab,"ref_gather_node_scalar_bin","s",1,sVar3);
                  return 1;
                }
              }
            }
          }
          if (1 < _nchunk->timing) {
            cVar2 = clock();
            _ref_private_macro_code_rss = (cVar2 - local_toc) + _ref_private_macro_code_rss;
          }
        }
        if (global != 0) {
          free((void *)global);
        }
        if (xyzm != (REF_DBL *)0x0) {
          free(xyzm);
        }
        if (1 < _nchunk->timing) {
          printf(" local %f mpi %f disk %f rank %d\n",(double)mpi_toc / 1000000.0,
                 (double)disk_toc / 1000000.0,(double)_ref_private_macro_code_rss / 1000000.0,
                 (ulong)(uint)_nchunk->id);
        }
        if (_nchunk->reduce_byte_limit < 1) {
          local_e0 = 0x7fffffff;
        }
        else {
          local_e0 = _nchunk->reduce_byte_limit / ((scalar_local._4_4_ + 1) * 8);
        }
        if ((local_xyzm._4_4_ == local_e0) && (_nchunk->id == 0)) {
          printf("mpi reduce limited to %d chunks of %d bytes\n",(ulong)(uint)local_xyzm,
                 (ulong)(uint)(local_xyzm._4_4_ * (scalar_local._4_4_ + 1) * 8));
        }
        ref_node_local._4_4_ = 0;
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_bin(REF_NODE ref_node,
                                                     REF_INT ldim,
                                                     REF_DBL *scalar,
                                                     FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk, nchunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;
  clock_t tic = 0;
  clock_t local_toc = 0;
  clock_t mpi_toc = 0;
  clock_t disk_toc = 0;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, (ldim + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (ldim + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (ldim + 1) * chunk, REF_DBL);

  nchunk = 0;
  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    nchunk++;
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;
    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    for (i = 0; i < (ldim + 1) * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        for (im = 0; im < ldim; im++)
          local_xyzm[im + (ldim + 1) * i] = scalar[im + ldim * local];
        local_xyzm[ldim + (ldim + 1) * i] = 1.0;
      } else {
        for (im = 0; im < (ldim + 1); im++)
          local_xyzm[im + (ldim + 1) * i] = 0.0;
      }
    }
    if (1 < ref_mpi_timing(ref_mpi)) local_toc += (clock() - tic);

    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (ldim + 1) * n, REF_DBL_TYPE),
        "sum");
    if (1 < ref_mpi_timing(ref_mpi)) mpi_toc += (clock() - tic);

    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[ldim + (ldim + 1) * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[ldim + (ldim + 1) * i]);
        }
        for (im = 0; im < ldim; im++) {
          REIS(1,
               fwrite(&(xyzm[im + (ldim + 1) * i]), sizeof(REF_DBL), 1, file),
               "s");
        }
      }
    if (1 < ref_mpi_timing(ref_mpi)) disk_toc += (clock() - tic);
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  if (1 < ref_mpi_timing(ref_mpi)) {
    printf(" local %f mpi %f disk %f rank %d\n",
           ((REF_DBL)local_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)mpi_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)disk_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ref_mpi_rank(ref_mpi));
  }

  if (chunk == ref_mpi_reduce_chunk_limit(
                   ref_mpi, (ldim + 1) * (REF_INT)sizeof(REF_DBL))) {
    if (ref_mpi_once(ref_mpi)) {
      printf("mpi reduce limited to %d chunks of %d bytes\n", nchunk,
             chunk * (ldim + 1) * (REF_INT)sizeof(REF_DBL));
    }
  }

  return REF_SUCCESS;
}